

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.hpp
# Opt level: O2

void __thiscall
libtorrent::create_file_entry::create_file_entry
          (create_file_entry *this,string *fn,int64_t sz,file_flags_t f,time_t ts,string *sl)

{
  ::std::__cxx11::string::string((string *)this,(string *)fn);
  this->size = sz;
  (this->flags).m_val = f.m_val;
  this->mtime = ts;
  ::std::__cxx11::string::string((string *)&this->symlink,(string *)sl);
  return;
}

Assistant:

create_file_entry(std::string fn, std::int64_t const sz
			, file_flags_t const f = {}, std::time_t const ts = 0, std::string sl = {})
			: filename(std::move(fn))
			, size(sz)
			, flags(f)
			, mtime(ts)
			, symlink(std::move(sl))
		{}